

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterHasNoReset.cpp
# Opt level: O0

string * __thiscall RegisterHasNoReset::description_abi_cxx11_(RegisterHasNoReset *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  text_style *in_stack_ffffffffffffff40;
  string_view in_stack_ffffffffffffff48;
  
  __lhs = in_RDI;
  ::fmt::v11::text_style::text_style
            ((text_style *)in_RDI,(emphasis)((ulong)in_stack_fffffffffffffee8 >> 0x38));
  ::fmt::v11::format<>(in_stack_ffffffffffffff40,(format_string<>)in_stack_ffffffffffffff48);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  ::fmt::v11::text_style::text_style
            ((text_style *)in_RDI,(emphasis)((ulong)&stack0xffffffffffffff24 >> 0x38));
  ::fmt::v11::format<>(in_stack_ffffffffffffff40,(format_string<>)in_stack_ffffffffffffff48);
  std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return __lhs;
}

Assistant:

std::string description() const override {
        return "A register in an always_ff, which contains the reset signal on its sensitivity "
               "list, which\ndo not have a value when the design is on reset. This will cause "
               "errors with "
               "synthesis\ntools since they will use an incorrect register cell.\n\n" +
               fmt::format(fmt::emphasis::italic,
                           "module m (logic clk, logic reset);\n"
                           "    logic r;\n"
                           "    always_ff @(posedge clk or negedge reset) begin\n"
                           "                               ^^^^^^^^^^^^^------\\\n"
                           "                                                  \\\n"
                           "        r <= 1'b1;                                \\\n"
                           "        ^~~~Register r do not have a value when reset\n"
                           "    end\n"
                           "endmodule\n\n") +
               "Instead the always_ff should be written like this:\n\n" +
               fmt::format(fmt::emphasis::italic, "module m (logic clk, logic reset);\n"
                                                  "    logic r;\n"
                                                  "    always_ff @(posedge clk) begin\n"
                                                  "        r <= 1'b1;\n"
                                                  "    end\n"
                                                  "endmodule\n");
    }